

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_realloc.h
# Opt level: O1

void __thiscall
vector_realloc<unsigned_char_*,_16U>::push_back
          (vector_realloc<unsigned_char_*,_16U> *this,uchar **t)

{
  size_t sVar1;
  uchar **ppuVar2;
  size_t sVar3;
  
  if (this->_size == this->_capacity) {
    sVar1 = this->_capacity * 2;
    sVar3 = 0x10;
    if (sVar1 != 0) {
      sVar3 = sVar1;
    }
    this->_capacity = sVar3;
    ppuVar2 = (uchar **)realloc(this->_data,sVar3 << 3);
    this->_data = ppuVar2;
  }
  sVar1 = this->_size;
  this->_data[sVar1] = *t;
  this->_size = sVar1 + 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (_size == _capacity) { grow(); }
		_data[_size] = t;
		++_size;
	}